

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkDouble(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  int iVar6;
  long lVar7;
  char Buffer [500];
  
  if (pNtk->ntkType == ABC_NTK_LOGIC) {
    pNtk_00 = Abc_NtkAlloc(ABC_NTK_LOGIC,pNtk->ntkFunc,1);
    sprintf(Buffer,"%s%s",pNtk->pName,"_2x");
    pcVar3 = Extra_UtilStrsav(Buffer);
    pNtk_00->pName = pcVar3;
    Abc_NtkCleanCopy(pNtk);
    for (iVar6 = 0; iVar6 < pNtk->vPis->nSize; iVar6 = iVar6 + 1) {
      pAVar4 = Abc_NtkPi(pNtk,iVar6);
      Abc_NtkDupObj(pNtk_00,pAVar4,0);
    }
    for (iVar6 = 0; iVar6 < pNtk->vPos->nSize; iVar6 = iVar6 + 1) {
      pAVar4 = Abc_NtkPo(pNtk,iVar6);
      Abc_NtkDupObj(pNtk_00,pAVar4,0);
    }
    for (iVar6 = 0; iVar6 < pNtk->vBoxes->nSize; iVar6 = iVar6 + 1) {
      pAVar4 = Abc_NtkBox(pNtk,iVar6);
      Abc_NtkDupBox(pNtk_00,pAVar4,0);
    }
    for (iVar6 = 0; iVar1 = pNtk->vObjs->nSize, iVar6 < iVar1; iVar6 = iVar6 + 1) {
      pAVar4 = Abc_NtkObj(pNtk,iVar6);
      if ((pAVar4 != (Abc_Obj_t *)0x0) && ((pAVar4->field_6).pTemp == (void *)0x0)) {
        Abc_NtkDupObj(pNtk_00,pAVar4,0);
      }
    }
    for (iVar6 = 0; iVar6 < iVar1; iVar6 = iVar6 + 1) {
      pAVar4 = Abc_NtkObj(pNtk,iVar6);
      if (((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xe) != 8)) &&
         ((uVar2 = *(uint *)&pAVar4->field_0x14 & 0xf, uVar2 != 5 && (uVar2 != 10)))) {
        for (lVar7 = 0; lVar7 < (pAVar4->vFanins).nSize; lVar7 = lVar7 + 1) {
          Abc_ObjAddFanin((pAVar4->field_6).pCopy,
                          *(Abc_Obj_t **)
                           ((long)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[lVar7]] +
                           0x40));
        }
      }
      iVar1 = pNtk->vObjs->nSize;
    }
    Abc_NtkCleanCopy(pNtk);
    for (iVar6 = 0; iVar6 < pNtk->vPis->nSize; iVar6 = iVar6 + 1) {
      pAVar4 = Abc_NtkPi(pNtk,iVar6);
      Abc_NtkDupObj(pNtk_00,pAVar4,0);
    }
    for (iVar6 = 0; iVar6 < pNtk->vPos->nSize; iVar6 = iVar6 + 1) {
      pAVar4 = Abc_NtkPo(pNtk,iVar6);
      Abc_NtkDupObj(pNtk_00,pAVar4,0);
    }
    for (iVar6 = 0; iVar6 < pNtk->vBoxes->nSize; iVar6 = iVar6 + 1) {
      pAVar4 = Abc_NtkBox(pNtk,iVar6);
      Abc_NtkDupBox(pNtk_00,pAVar4,0);
    }
    for (iVar6 = 0; iVar1 = pNtk->vObjs->nSize, iVar6 < iVar1; iVar6 = iVar6 + 1) {
      pAVar4 = Abc_NtkObj(pNtk,iVar6);
      if ((pAVar4 != (Abc_Obj_t *)0x0) && ((pAVar4->field_6).pTemp == (void *)0x0)) {
        Abc_NtkDupObj(pNtk_00,pAVar4,0);
      }
    }
    for (iVar6 = 0; iVar6 < iVar1; iVar6 = iVar6 + 1) {
      pAVar4 = Abc_NtkObj(pNtk,iVar6);
      if ((((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xe) != 8)) &&
          (uVar2 = *(uint *)&pAVar4->field_0x14 & 0xf, uVar2 != 5)) && (uVar2 != 10)) {
        for (lVar7 = 0; lVar7 < (pAVar4->vFanins).nSize; lVar7 = lVar7 + 1) {
          Abc_ObjAddFanin((pAVar4->field_6).pCopy,
                          *(Abc_Obj_t **)
                           ((long)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[lVar7]] +
                           0x40));
        }
      }
      iVar1 = pNtk->vObjs->nSize;
    }
    for (iVar6 = 0; iVar6 < pNtk->vCis->nSize; iVar6 = iVar6 + 1) {
      pAVar4 = Abc_NtkCi(pNtk,iVar6);
      pAVar5 = Abc_NtkCi(pNtk_00,iVar6);
      pcVar3 = Abc_ObjName(pAVar4);
      Abc_ObjAssignName(pAVar5,"1_",pcVar3);
      pAVar5 = Abc_NtkCi(pNtk_00,pNtk->vCis->nSize + iVar6);
      pcVar3 = Abc_ObjName(pAVar4);
      Abc_ObjAssignName(pAVar5,"2_",pcVar3);
    }
    for (iVar6 = 0; iVar6 < pNtk->vCos->nSize; iVar6 = iVar6 + 1) {
      pAVar4 = Abc_NtkCo(pNtk,iVar6);
      pAVar5 = Abc_NtkCo(pNtk_00,iVar6);
      pcVar3 = Abc_ObjName(pAVar4);
      Abc_ObjAssignName(pAVar5,"1_",pcVar3);
      pAVar5 = Abc_NtkCo(pNtk_00,pNtk->vCos->nSize + iVar6);
      pcVar3 = Abc_ObjName(pAVar4);
      Abc_ObjAssignName(pAVar5,"2_",pcVar3);
    }
    Abc_NtkOrderCisCos(pNtk_00);
    iVar6 = Abc_NtkCheck(pNtk_00);
    if (iVar6 == 0) {
      fwrite("Abc_NtkDup(): Network check has failed.\n",0x28,1,_stdout);
    }
    return pNtk_00;
  }
  __assert_fail("Abc_NtkIsLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                ,0x2a4,"Abc_Ntk_t *Abc_NtkDouble(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkDouble( Abc_Ntk_t * pNtk )
{
    char Buffer[500];
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    assert( Abc_NtkIsLogic(pNtk) );

    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    sprintf( Buffer, "%s%s", pNtk->pName, "_2x" );
    pNtkNew->pName = Extra_UtilStrsav(Buffer);

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // clone CIs/CIs/boxes
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
    Abc_NtkForEachBox( pNtk, pObj, i )
        Abc_NtkDupBox( pNtkNew, pObj, 0 );
    // copy the internal nodes
    // duplicate the nets and nodes (CIs/COs/latches already dupped)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->pCopy == NULL )
            Abc_NtkDupObj(pNtkNew, pObj, 0);
    // reconnect all objects (no need to transfer attributes on edges)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // clone CIs/CIs/boxes
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 0 );
    Abc_NtkForEachBox( pNtk, pObj, i )
        Abc_NtkDupBox( pNtkNew, pObj, 0 );
    // copy the internal nodes
    // duplicate the nets and nodes (CIs/COs/latches already dupped)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->pCopy == NULL )
            Abc_NtkDupObj(pNtkNew, pObj, 0);
    // reconnect all objects (no need to transfer attributes on edges)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );

    // assign names
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        Abc_ObjAssignName( Abc_NtkCi(pNtkNew,                      i), "1_", Abc_ObjName(pObj) );
        Abc_ObjAssignName( Abc_NtkCi(pNtkNew, Abc_NtkCiNum(pNtk) + i), "2_", Abc_ObjName(pObj) );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        Abc_ObjAssignName( Abc_NtkCo(pNtkNew,                      i), "1_", Abc_ObjName(pObj) );
        Abc_ObjAssignName( Abc_NtkCo(pNtkNew, Abc_NtkCoNum(pNtk) + i), "2_", Abc_ObjName(pObj) );
    }
    Abc_NtkOrderCisCos( pNtkNew );

    // perform the final check
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkDup(): Network check has failed.\n" );
    return pNtkNew;
}